

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O0

wchar_t lzx_decode(lzx_stream *strm,wchar_t last)

{
  lzx_dec *plVar1;
  long lVar2;
  long lVar3;
  int64_t bytes_written;
  wchar_t r;
  int64_t avail_in;
  lzx_dec *ds;
  wchar_t last_local;
  lzx_stream *strm_local;
  
  plVar1 = strm->ds;
  if (plVar1->error == L'\0') {
    lVar2 = strm->avail_in;
    lzx_br_fixup(strm,&plVar1->br);
    do {
      if (plVar1->state < L'\x12') {
        bytes_written._4_4_ = lzx_read_blocks(strm,last);
      }
      else {
        lVar3 = strm->avail_out;
        bytes_written._4_4_ = lzx_decode_blocks(strm,last);
        lVar3 = lVar3 - strm->avail_out;
        strm->next_out = strm->next_out + lVar3;
        strm->total_out = lVar3 + strm->total_out;
      }
    } while (bytes_written._4_4_ == L'd');
    strm->total_in = (lVar2 - strm->avail_in) + strm->total_in;
    strm_local._4_4_ = bytes_written._4_4_;
  }
  else {
    strm_local._4_4_ = plVar1->error;
  }
  return strm_local._4_4_;
}

Assistant:

static int
lzx_decode(struct lzx_stream *strm, int last)
{
	struct lzx_dec *ds = strm->ds;
	int64_t avail_in;
	int r;

	if (ds->error)
		return (ds->error);

	avail_in = strm->avail_in;
	lzx_br_fixup(strm, &(ds->br));
	do {
		if (ds->state < ST_MAIN)
			r = lzx_read_blocks(strm, last);
		else {
			int64_t bytes_written = strm->avail_out;
			r = lzx_decode_blocks(strm, last);
			bytes_written -= strm->avail_out;
			strm->next_out += bytes_written;
			strm->total_out += bytes_written;
		}
	} while (r == 100);
	strm->total_in += avail_in - strm->avail_in;
	return (r);
}